

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O0

void __thiscall
FIX::SocketAcceptor::onDisconnect(SocketAcceptor *this,SocketServer *param_1,socket_handle s)

{
  SocketConnection *this_00;
  bool bVar1;
  pointer ppVar2;
  Session *this_01;
  Session *pSession;
  SocketConnection *pSocketConnection;
  _Self local_28;
  iterator i;
  socket_handle s_local;
  SocketServer *param_1_local;
  SocketAcceptor *this_local;
  
  i._M_node._4_4_ = s;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
       ::find(&this->m_connections,(key_type *)((long)&i._M_node + 4));
  pSocketConnection =
       (SocketConnection *)
       std::
       map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
       ::end(&this->m_connections);
  bVar1 = std::operator==(&local_28,(_Self *)&pSocketConnection);
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>::operator->
                       (&local_28);
    this_00 = ppVar2->second;
    this_01 = SocketConnection::getSession(this_00);
    if (this_01 != (Session *)0x0) {
      Session::disconnect(this_01);
    }
    if (this_00 != (SocketConnection *)0x0) {
      (*(this_00->super_Responder)._vptr_Responder[1])();
    }
    std::
    map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
    ::erase(&this->m_connections,(key_type *)((long)&i._M_node + 4));
  }
  return;
}

Assistant:

void SocketAcceptor::onDisconnect(SocketServer &, socket_handle s) {
  SocketConnections::iterator i = m_connections.find(s);
  if (i == m_connections.end()) {
    return;
  }
  SocketConnection *pSocketConnection = i->second;

  Session *pSession = pSocketConnection->getSession();
  if (pSession) {
    pSession->disconnect();
  }

  delete pSocketConnection;
  m_connections.erase(s);
}